

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> __thiscall
fmt::v8::detail::
write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128,char32_t>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,
          unsigned___int128 value,uint prefix,basic_format_specs<char32_t> *specs,
          digit_grouping<char32_t> *grouping)

{
  byte bVar1;
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined8 *in_R9;
  char digits [40];
  undefined8 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  anon_class_32_4_dca7119b local_78;
  detail local_58 [40];
  
  iVar7 = (int)specs;
  n._8_4_ = in_stack_ffffffffffffff80;
  n._0_8_ = in_stack_ffffffffffffff78;
  n._12_4_ = iVar7;
  iVar2 = count_digits_fallback<unsigned__int128>((detail *)out.container,(unsigned___int128)n);
  value_00._8_4_ = iVar2;
  value_00._0_8_ = in_stack_ffffffffffffff78;
  value_00._12_4_ = iVar7;
  format_decimal<char,unsigned__int128>
            (local_58,(char *)out.container,(unsigned___int128)value_00,prefix);
  pbVar4 = (byte *)*in_R9;
  pbVar6 = pbVar4 + in_R9[1];
  uVar5 = iVar2 - (uint)(iVar7 == 0);
  iVar7 = 0;
  do {
    iVar9 = 0x7fffffff;
    if (*(int *)(in_R9 + 4) != 0) {
      if (pbVar4 == pbVar6) {
        uVar8 = (uint)(char)pbVar6[-1];
      }
      else {
        bVar1 = *pbVar4;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_001720de;
        pbVar4 = pbVar4 + 1;
        uVar8 = (uint)bVar1;
      }
      iVar7 = iVar7 + uVar8;
      iVar9 = iVar7;
    }
LAB_001720de:
    uVar5 = uVar5 + 1;
    if (iVar2 <= iVar9) {
      if (-1 < (int)uVar5) {
        local_78.prefix = (uint *)&stack0xffffffffffffff84;
        local_78.num_digits = (int *)&stack0xffffffffffffff80;
        local_78.digits = (char (*) [40])local_58;
        bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128,char32_t>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char32_t>const&,fmt::v8::detail::digit_grouping<char32_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_>
                          ((back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)this,
                           (basic_format_specs<char32_t> *)grouping,(ulong)uVar5,(ulong)uVar5,
                           &local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar3.container;
      }
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
  } while( true );
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}